

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::JobManager::PrepareJobs
          (Error *__return_storage_ptr__,JobManager *this,Expression *aExpr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids,bool aGroupAlias)

{
  string *this_00;
  _Rb_tree_header *p_Var1;
  ErrorCode EVar2;
  ulong uVar3;
  uint64_t uVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  ulong *puVar10;
  long lVar11;
  Error importError;
  Expression jobExpr;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  ErrorCode local_bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  ulong *local_b0;
  string local_a8;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_b8 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_b8;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  utils::ToLower((string *)local_e8,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  iVar7 = std::__cxx11::string::compare(local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != &local_d8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_e8._4_4_,local_e8._0_4_));
  }
  if (iVar7 == 0) {
    PrepareStartJobs((Error *)local_e8,this,aExpr,aNids,aGroupAlias);
  }
  else {
    utils::ToLower((string *)local_e8,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    iVar7 = std::__cxx11::string::compare(local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != &local_d8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_e8._4_4_,local_e8._0_4_));
    }
    if (iVar7 != 0) {
      puVar10 = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_b0 = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      if (puVar10 == local_b0) {
        return __return_storage_ptr__;
      }
      p_Var1 = &(this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header;
      while (p_Var8 = (this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_parent, p_Var8 == (_Base_ptr)0x0) {
LAB_001fc575:
        if (!aGroupAlias) {
          uVar4 = *puVar10;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"not started","");
          WarningMsg(this,uVar4,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
switchD_001fc7b6_caseD_0:
        puVar10 = puVar10 + 1;
        if (puVar10 == local_b0) {
          return __return_storage_ptr__;
        }
      }
      uVar3 = *puVar10;
      p_Var9 = &p_Var1->_M_header;
      do {
        if (*(ulong *)(p_Var8 + 1) >= uVar3) {
          p_Var9 = p_Var8;
        }
        p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < uVar3];
      } while (p_Var8 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var9 == p_Var1) ||
         (uVar3 < ((_Rb_tree_header *)p_Var9)->_M_node_count)) goto LAB_001fc575;
      bVar5 = Interpreter::IsInactiveCommissionerAllowed(this->mInterpreter,aExpr);
      if (bVar5) {
LAB_001fc66c:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_68,aExpr);
        if ((this->mImportFile)._M_string_length == 0) {
LAB_001fc731:
          CreateJob((Error *)local_e8,this,(CommissionerAppPtr *)((long)p_Var9 + 0x28),&local_68,
                    *puVar10);
          __return_storage_ptr__->mCode = local_e8._0_4_;
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
          EVar2 = __return_storage_ptr__->mCode;
          if (local_e0._M_p != local_d8._M_local_buf + 8) {
            operator_delete(local_e0._M_p);
          }
          lVar11 = (ulong)(EVar2 != kNone) << 2;
        }
        else {
          AppendImport((Error *)local_e8,this,*puVar10,&local_68);
          local_bc = local_e8._0_4_;
          if (local_e8._0_4_ == kNone) {
            lVar11 = 0;
          }
          else {
            uVar4 = *puVar10;
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,local_e0._M_p,
                       local_e0._M_p + local_d8._M_allocated_capacity);
            ErrorMsg(this,uVar4,&local_88);
            lVar11 = 8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p);
            }
          }
          if (local_e0._M_p != local_d8._M_local_buf + 8) {
            operator_delete(local_e0._M_p);
          }
          if (local_bc == kNone) goto LAB_001fc731;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
      }
      else {
        bVar6 = (**(code **)(**(long **)((long)p_Var9 + 0x28) + 0x78))();
        if (bVar6 == 0 && !aGroupAlias) {
          uVar4 = *puVar10;
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"not started","");
          WarningMsg(this,uVar4,&local_a8);
          lVar11 = 8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
        }
        else {
          lVar11 = (ulong)(bVar6 ^ 1) << 3;
        }
        if (bVar6 != 0) goto LAB_001fc66c;
      }
      switch(lVar11) {
      case 0:
      case 8:
        goto switchD_001fc7b6_caseD_0;
      case 4:
        return __return_storage_ptr__;
      default:
        local_e0._M_p = (this_00->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_p == local_b8) {
          return __return_storage_ptr__;
        }
        goto LAB_001fc828;
      }
    }
    PrepareStopJobs((Error *)local_e8,this,aExpr,aNids,aGroupAlias);
  }
  __return_storage_ptr__->mCode = local_e8._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
  if (local_e0._M_p != local_d8._M_local_buf + 8) {
LAB_001fc828:
    operator_delete(local_e0._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::PrepareJobs(const Interpreter::Expression &aExpr,
                              const std::vector<uint64_t>   &aNids,
                              bool                           aGroupAlias)
{
    Error error;

    if (utils::ToLower(aExpr[0]) == "start")
    {
        ExitNow(error = PrepareStartJobs(aExpr, aNids, aGroupAlias));
    }
    else if (utils::ToLower(aExpr[0]) == "stop")
    {
        ExitNow(error = PrepareStopJobs(aExpr, aNids, aGroupAlias));
    }

    for (const auto &nid : aNids)
    {
        auto entry = mCommissionerPool.find(nid);
        if (entry == mCommissionerPool.end())
        {
            if (!aGroupAlias)
            {
                WarningMsg(nid, "not started");
            }
            continue;
        }

        bool isInactiveAllowed = mInterpreter.IsInactiveCommissionerAllowed(aExpr);
        if (!isInactiveAllowed)
        {
            bool active = entry->second->IsActive();
            if (!active)
            {
                if (!aGroupAlias)
                {
                    WarningMsg(nid, "not started");
                }
                continue;
            }
        }

        Interpreter::Expression jobExpr = aExpr;

        if (!mImportFile.empty())
        {
            Error importError = AppendImport(nid, jobExpr);
            if (importError != ERROR_NONE)
            {
                ErrorMsg(nid, importError.GetMessage());
                continue;
            }
        }

        SuccessOrExit(error = CreateJob(entry->second, jobExpr, nid));
    }

exit:
    return error;
}